

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O1

void __thiscall Wiener::Wiener(Wiener *this,Time *time,string *name,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  string local_40;
  
  RandN::RandN(&this->super_RandN);
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,name,type);
  *(undefined ***)this = &PTR__Wiener_0015f7a0;
  *(undefined ***)&this->field_0x60 = &PTR__Wiener_0015f860;
  *(undefined ***)&this->field_0x78 = &PTR__Wiener_0015f8a8;
  this->wienerMean = 0.0;
  this->wienerStdDev = 1.0;
  dVar2 = *(double *)(*(long *)&this->field_0x70 + 200);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  this->wienerSqrtDt = dVar2;
  std::__cxx11::string::_M_replace
            ((ulong)&this->field_0x128,0,*(char **)&this->field_0x130,0x14dd56);
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mean","");
  Parametric::addParameter((Parametric *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"variance","");
  Parametric::addParameter((Parametric *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*(long *)this + 0x68))(this);
  return;
}

Assistant:

Wiener::Wiener(Time *time, const string& name, const string& type)
	: StochasticVariable( time, name, type )
{
	wienerMean = 0.0;
	wienerStdDev = 1.0;
	wienerSqrtDt = sqrt(xTime->dt);
	stochDescription = "Wiener process";
	addParameter("mean");
	addParameter("variance");
	init();
}